

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::ChangeValueType
          (GlobOpt *this,BasicBlock *block,Value *value,ValueType newValueType,
          bool preserveSubclassInfo,bool allowIncompatibleType)

{
  Sym *this_00;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ObjectType OVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  ValueInfo *pVVar7;
  undefined7 in_register_00000089;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  undefined4 local_38;
  ValueType valueType;
  ValueType newValueType_local;
  
  local_38 = (undefined4)CONCAT71(in_register_00000089,allowIncompatibleType);
  valueType.field_0 = newValueType.field_0;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3178,"(value)","value");
    if (!bVar2) goto LAB_00429210;
    *puVar5 = 0;
  }
  bVar2 = ValueInfo::IsJsType(value->valueInfo);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x317a,"(!value->GetValueInfo()->IsJsType())",
                       "!value->GetValueInfo()->IsJsType()");
    if (!bVar2) goto LAB_00429210;
    *puVar5 = 0;
  }
  pVVar7 = value->valueInfo;
  local_3a = (pVVar7->super_ValueType).field_0;
  bVar2 = ValueType::operator==((ValueType *)&local_3a.field_0,newValueType);
  if (bVar2) {
    if (preserveSubclassInfo) {
      return;
    }
    bVar2 = ValueInfo::IsGeneric(pVVar7);
    if (bVar2) {
      return;
    }
  }
  else if ((preserveSubclassInfo) && (bVar2 = ValueInfo::IsArrayValueInfo(pVVar7), bVar2)) {
    bVar2 = ValueType::IsObject(&valueType);
    if (bVar2) {
      OVar3 = ValueType::GetObjectType(&valueType);
      OVar4 = ValueType::GetObjectType(&pVVar7->super_ValueType);
      if (OVar3 == OVar4) goto LAB_0042915b;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3187,
                       "(!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType())"
                       ,
                       "!preserveSubclassInfo || !valueInfo->IsArrayValueInfo() || newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType()"
                      );
    if (!bVar2) goto LAB_00429210;
    *puVar5 = 0;
  }
LAB_0042915b:
  this_00 = pVVar7->symStore;
  if (((this_00 != (Sym *)0x0) && (this_00->m_kind == SymKindStack)) &&
     (pSVar6 = Sym::AsStackSym(this_00), (pSVar6->field_0x1a & 4) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3189,
                       "(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())"
                       ,
                       "!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable()"
                      );
    if (!bVar2) {
LAB_00429210:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (preserveSubclassInfo) {
    pVVar7 = ValueInfo::Copy(pVVar7,this->alloc);
  }
  else {
    pVVar7 = ValueInfo::CopyWithGenericStructureKind(pVVar7,this->alloc);
  }
  (pVVar7->super_ValueType).field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)valueType.field_0;
  ChangeValueInfo(this,block,value,pVVar7,local_38._0_1_,false);
  return;
}

Assistant:

void
GlobOpt::ChangeValueType(
    BasicBlock *const block,
    Value *const value,
    const ValueType newValueType,
    const bool preserveSubclassInfo,
    const bool allowIncompatibleType) const
{
    Assert(value);
    // Why are we trying to change the value type of the type sym value? Asserting here to make sure we don't deep copy the type sym's value info.
    Assert(!value->GetValueInfo()->IsJsType());

    ValueInfo *const valueInfo = value->GetValueInfo();
    const ValueType valueType(valueInfo->Type());
    if(valueType == newValueType && (preserveSubclassInfo || valueInfo->IsGeneric()))
    {
        return;
    }

    // ArrayValueInfo has information specific to the array type, so make sure that doesn't change
    Assert(
        !preserveSubclassInfo ||
        !valueInfo->IsArrayValueInfo() ||
        newValueType.IsObject() && newValueType.GetObjectType() == valueInfo->GetObjectType());

    Assert(!valueInfo->GetSymStore() || !valueInfo->GetSymStore()->IsStackSym() || !valueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable());

    ValueInfo *const newValueInfo =
        preserveSubclassInfo
            ? valueInfo->Copy(alloc)
            : valueInfo->CopyWithGenericStructureKind(alloc);
    newValueInfo->Type() = newValueType;
    ChangeValueInfo(block, value, newValueInfo, allowIncompatibleType);
}